

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_accept_op.hpp
# Opt level: O0

void __thiscall
asio::detail::
reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
::do_assign(reactive_socket_accept_op_base<asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ip::tcp>
            *this)

{
  long lVar1;
  basic_socket<asio::ip::tcp,_asio::any_io_executor> *pbVar2;
  bool bVar3;
  socket_type sVar4;
  basic_socket<asio::ip::tcp,_asio::any_io_executor> *in_RDI;
  size_t in_stack_ffffffffffffffc8;
  basic_endpoint<asio::ip::tcp> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  native_handle_type *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  basic_socket<asio::ip::tcp,_asio::any_io_executor> *this_00;
  
  this_00 = in_RDI;
  sVar4 = socket_holder::get((socket_holder *)
                             &(in_RDI->impl_).executor_.
                              super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                              .super_any_executor_base.target_fns_);
  if (sVar4 != -1) {
    pbVar2 = in_RDI + 1;
    lVar1._0_4_ = (pbVar2->impl_).implementation_.super_base_implementation_type.socket_;
    lVar1._4_1_ = (pbVar2->impl_).implementation_.super_base_implementation_type.state_;
    lVar1._5_3_ = *(undefined3 *)
                   &(pbVar2->impl_).implementation_.super_base_implementation_type.field_0x5;
    if (lVar1 != 0) {
      asio::ip::basic_endpoint<asio::ip::tcp>::resize
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
    sVar4 = socket_holder::get((socket_holder *)
                               &(in_RDI->impl_).executor_.
                                super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                                .super_any_executor_base.target_fns_);
    basic_socket<asio::ip::tcp,_asio::any_io_executor>::assign
              (this_00,(protocol_type *)CONCAT44(sVar4,in_stack_fffffffffffffff0),
               in_stack_ffffffffffffffe8,
               (error_code *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    bVar3 = std::error_code::operator_cast_to_bool
                      ((error_code *)&(in_RDI->impl_).implementation_.protocol_);
    if (!bVar3) {
      socket_holder::release
                ((socket_holder *)
                 &(in_RDI->impl_).executor_.
                  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                  .super_any_executor_base.target_fns_);
    }
  }
  return;
}

Assistant:

void do_assign()
  {
    if (new_socket_.get() != invalid_socket)
    {
      if (peer_endpoint_)
        peer_endpoint_->resize(addrlen_);
      peer_.assign(protocol_, new_socket_.get(), ec_);
      if (!ec_)
        new_socket_.release();
    }
  }